

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

int coda_ascii_cursor_read_uint8(coda_cursor *cursor,uint8_t *dst)

{
  int iVar1;
  ulong local_28;
  uint64_t value;
  uint8_t *dst_local;
  coda_cursor *cursor_local;
  
  value = (uint64_t)dst;
  dst_local = (uint8_t *)cursor;
  iVar1 = coda_ascii_cursor_read_uint64(cursor,&local_28);
  if (iVar1 == 0) {
    if (local_28 < 0x100) {
      *(char *)value = (char)local_28;
      cursor_local._4_4_ = 0;
    }
    else {
      coda_set_error(-300,"product error detected (value for ascii integer too large for uint8)");
      cursor_local._4_4_ = -1;
    }
  }
  else {
    cursor_local._4_4_ = -1;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascii_cursor_read_uint8(const coda_cursor *cursor, uint8_t *dst)
{
    uint64_t value;

    if (coda_ascii_cursor_read_uint64(cursor, &value) != 0)
    {
        return -1;
    }
    if (value > MAXUINT8)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (value for ascii integer too large for uint8)");
        return -1;
    }
    *dst = (uint8_t)value;

    return 0;
}